

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_destroy(cubeb_conflict *ctx)

{
  void *in_RDI;
  
  free(*(void **)((long)in_RDI + 0x28));
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    pulse_context_destroy(ctx);
  }
  if (*(long *)((long)in_RDI + 0x10) != 0) {
    (*cubeb_pa_threaded_mainloop_stop)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
    (*cubeb_pa_threaded_mainloop_free)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
  }
  if (*(long *)((long)in_RDI + 0x58) != 0) {
    cubeb_strings_destroy((cubeb_strings *)ctx);
  }
  if (*(long *)((long)in_RDI + 8) != 0) {
    dlclose(*(undefined8 *)((long)in_RDI + 8));
  }
  free(*(void **)((long)in_RDI + 0x20));
  free(in_RDI);
  return;
}

Assistant:

static void
pulse_destroy(cubeb * ctx)
{
  free(ctx->context_name);
  if (ctx->context) {
    pulse_context_destroy(ctx);
  }

  if (ctx->mainloop) {
    WRAP(pa_threaded_mainloop_stop)(ctx->mainloop);
    WRAP(pa_threaded_mainloop_free)(ctx->mainloop);
  }

  if (ctx->device_ids) {
    cubeb_strings_destroy(ctx->device_ids);
  }

  if (ctx->libpulse) {
    dlclose(ctx->libpulse);
  }
  free(ctx->default_sink_info);
  free(ctx);
}